

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4.h
# Opt level: O3

void ncnn::conv3x3s1_winograd23_transform_kernel_pack4_sse
               (Mat *kernel,Mat *kernel_tm_pack4,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  int *piVar14;
  undefined1 auVar15 [32];
  long lVar16;
  long lVar17;
  undefined4 *puVar18;
  int iVar19;
  long lVar20;
  undefined8 *puVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  void *pvVar25;
  ulong uVar26;
  undefined4 *puVar27;
  void *pvVar28;
  undefined4 *puVar29;
  int i;
  long lVar30;
  undefined4 *puVar31;
  void *pvVar32;
  int j;
  long lVar33;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  float tmp [4] [3];
  Mat local_b8;
  undefined1 local_68 [32];
  undefined1 local_48 [16];
  
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  Mat::create(&local_b8,0x10,inch,outch,4,(Allocator *)0x0);
  auVar15 = _DAT_00519280;
  if (0 < outch) {
    pvVar11 = kernel->data;
    uVar26 = 0;
    pvVar32 = local_b8.data;
    do {
      if (0 < inch) {
        iVar24 = inch * 9 * (int)uVar26;
        uVar22 = 0;
        pvVar25 = pvVar32;
        do {
          fVar1 = *(float *)((long)pvVar11 + uVar22 * 0x24 + (long)iVar24 * 4);
          fVar2 = *(float *)((long)pvVar11 + uVar22 * 0x24 + (long)iVar24 * 4 + 4);
          fVar3 = *(float *)((long)pvVar11 + uVar22 * 0x24 + (long)iVar24 * 4 + 8);
          fVar4 = *(float *)((long)pvVar11 + uVar22 * 0x24 + (long)iVar24 * 4 + 0xc);
          fVar5 = *(float *)((long)pvVar11 + uVar22 * 0x24 + (long)iVar24 * 4 + 0x10);
          fVar6 = *(float *)((long)pvVar11 + uVar22 * 0x24 + (long)iVar24 * 4 + 0x14);
          fVar7 = *(float *)((long)pvVar11 + uVar22 * 0x24 + (long)iVar24 * 4 + 0x18);
          fVar8 = *(float *)((long)pvVar11 + uVar22 * 0x24 + (long)iVar24 * 4 + 0x1c);
          fVar9 = *(float *)((long)pvVar11 + uVar22 * 0x24 + (long)iVar24 * 4 + 0x20);
          auVar35._0_4_ = fVar2 * 0.0 + fVar1 * 1.0 + fVar3 * 0.0;
          auVar35._4_4_ = fVar2 * 0.5 + fVar1 * 0.5 + fVar3 * 0.5;
          auVar35._8_4_ = fVar2 * -0.5 + fVar1 * 0.5 + fVar3 * 0.5;
          auVar35._12_4_ = fVar2 * 0.0 + fVar1 * 0.0 + fVar3 * 1.0;
          auVar36._0_4_ = fVar5 * 0.0 + fVar4 * 1.0 + fVar6 * 0.0;
          auVar36._4_4_ = fVar5 * 0.5 + fVar4 * 0.5 + fVar6 * 0.5;
          auVar36._8_4_ = fVar5 * -0.5 + fVar4 * 0.5 + fVar6 * 0.5;
          auVar36._12_4_ = fVar5 * 0.0 + fVar4 * 0.0 + fVar6 * 1.0;
          auVar37._0_8_ =
               CONCAT44(fVar8 * 0.5 + fVar7 * 0.5 + fVar9 * 0.5,
                        fVar8 * 0.0 + fVar7 * 1.0 + fVar9 * 0.0);
          auVar37._8_4_ = fVar8 * -0.5 + fVar7 * 0.5 + fVar9 * 0.5;
          auVar37._12_4_ = fVar8 * 0.0 + fVar7 * 0.0 + fVar9 * 1.0;
          auVar39._16_16_ = auVar36;
          auVar39._0_16_ = auVar35;
          auVar41 = vpermilps_avx(auVar39,auVar15);
          auVar40._16_16_ = auVar35;
          auVar40._0_16_ = auVar36;
          auVar39 = vmovsldup_avx(auVar40);
          auVar39 = vblendps_avx(auVar41,auVar39,0x42);
          auVar41._8_8_ = auVar37._0_8_;
          auVar41._0_8_ = auVar37._0_8_;
          auVar41._16_16_ = auVar37;
          local_68 = vblendps_avx(auVar39,auVar41,0x24);
          auVar36 = vshufps_avx(auVar35,auVar36,0xff);
          auVar35 = vshufpd_avx(auVar37,auVar37,3);
          local_48 = vblendps_avx(auVar35,auVar36,6);
          lVar33 = 0;
          pvVar28 = pvVar25;
          do {
            fVar1 = *(float *)(local_68 + lVar33 * 0xc);
            uVar10 = *(undefined8 *)(local_68 + lVar33 * 0xc + 4);
            puVar21 = &DAT_005194b4;
            lVar30 = 0;
            do {
              auVar38._0_4_ = (float)*puVar21 * (float)uVar10;
              auVar38._4_4_ = (float)((ulong)*puVar21 >> 0x20) * (float)((ulong)uVar10 >> 0x20);
              auVar38._8_8_ = 0;
              auVar35 = vmovshdup_avx(auVar38);
              *(float *)((long)pvVar28 + lVar30 * 4) =
                   auVar38._0_4_ + fVar1 * *(float *)((long)puVar21 + -4) + auVar35._0_4_;
              lVar30 = lVar30 + 1;
              puVar21 = (undefined8 *)((long)puVar21 + 0xc);
            } while (lVar30 != 4);
            lVar33 = lVar33 + 1;
            pvVar28 = (void *)((long)pvVar28 + 0x10);
          } while (lVar33 != 4);
          uVar22 = uVar22 + 1;
          pvVar25 = (void *)((long)pvVar25 +
                            (long)local_b8.w *
                            CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
        } while (uVar22 != (uint)inch);
      }
      uVar26 = uVar26 + 1;
      pvVar32 = (void *)((long)pvVar32 +
                        local_b8.cstep *
                        CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
    } while (uVar26 != (uint)outch);
  }
  iVar24 = inch + 3;
  if (-1 < inch) {
    iVar24 = inch;
  }
  iVar19 = outch + 3;
  if (-1 < outch) {
    iVar19 = outch;
  }
  Mat::create(kernel_tm_pack4,iVar24 >> 2,0x10,iVar19 >> 2,0x40,0x10,(Allocator *)0x0);
  if (3 < outch) {
    iVar24 = kernel_tm_pack4->w;
    pvVar11 = kernel_tm_pack4->data;
    sVar12 = kernel_tm_pack4->elemsize;
    sVar13 = kernel_tm_pack4->cstep;
    uVar26 = 0;
    do {
      lVar30 = local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
      lVar33 = (long)local_b8.w * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
      puVar31 = (undefined4 *)(lVar30 * uVar26 + (long)local_b8.data);
      lVar34 = 0;
      do {
        if (3 < inch) {
          lVar16 = (long)pvVar11 + (long)iVar24 * sVar12 * lVar34 + (uVar26 >> 2) * sVar13 * sVar12;
          lVar23 = 0;
          puVar27 = puVar31;
          do {
            lVar20 = 0;
            puVar29 = puVar27;
            do {
              lVar17 = lVar16;
              lVar16 = 0;
              puVar18 = puVar29;
              do {
                *(undefined4 *)(lVar17 + lVar16) = *puVar18;
                puVar18 = (undefined4 *)((long)puVar18 + lVar30);
                lVar16 = lVar16 + 4;
              } while (lVar16 != 0x10);
              lVar20 = lVar20 + 1;
              puVar29 = (undefined4 *)((long)puVar29 + lVar33);
              lVar16 = lVar17 + 0x10;
            } while (lVar20 != 4);
            lVar20 = lVar23 + 7;
            puVar27 = puVar27 + lVar33;
            lVar16 = lVar17 + 0x10;
            lVar23 = lVar23 + 4;
          } while (lVar20 < inch);
        }
        lVar34 = lVar34 + 1;
        puVar31 = puVar31 + 1;
      } while (lVar34 != 0x10);
      uVar22 = uVar26 + 7;
      uVar26 = uVar26 + 4;
    } while (uVar22 < (uint)outch);
  }
  piVar14 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_pack4_sse(const Mat& kernel, Mat& kernel_tm_pack4, int inch, int outch, const Option& opt)
{
    // winograd23 transform kernel
    Mat kernel_tm(4 * 4, inch, outch);

    const float ktm[4][3] = {
        {1.0f, 0.0f, 0.0f},
        {1.0f / 2, 1.0f / 2, 1.0f / 2},
        {1.0f / 2, -1.0f / 2, 1.0f / 2},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[4][3];
            for (int i = 0; i < 4; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 4; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 4; i++)
                {
                    kernel_tm0[j * 4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 16-inch-outch
    // dst = pb-pa-inch/pa-16-outch/pb
    kernel_tm_pack4.create(inch / 4, 16, outch / 4, (size_t)4u * 4 * 4, 4 * 4);

    for (int q = 0; q + 3 < outch; q += 4)
    {
        Mat g0 = kernel_tm_pack4.channel(q / 4);

        for (int k = 0; k < 16; k++)
        {
            float* g00 = g0.row<float>(k);

            for (int p = 0; p + 3 < inch; p += 4)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const float* k00 = kernel_tm.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}